

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O0

int color_from_gradient(gradient_t *gradient,float pos,pixel_color_t *color)

{
  gradient_color_t *right_00;
  gradient_color_t *right;
  gradient_color_t *pgStack_30;
  int i;
  gradient_color_t *left;
  pixel_color_t *color_local;
  float pos_local;
  gradient_t *gradient_local;
  
  right._4_4_ = 1;
  pgStack_30 = gradient->colors;
  while( true ) {
    if (gradient->num_colors <= right._4_4_) {
      return -1;
    }
    right_00 = gradient->colors + right._4_4_;
    if ((pgStack_30->pos <= pos) && (pos <= right_00->pos)) break;
    right._4_4_ = right._4_4_ + 1;
    pgStack_30 = right_00;
  }
  color_from_gradient_range(pgStack_30,right_00,pos,color);
  return 0;
}

Assistant:

int color_from_gradient(const gradient_t *gradient, float pos, pixel_color_t *color)
{
    gradient_color_t *left = &gradient->colors[0];

    for (int i = 1; i < gradient->num_colors; ++i) {
        gradient_color_t *right = &gradient->colors[i];

        if (pos >= left->pos && pos <= right->pos) {
            color_from_gradient_range(left, right, pos, color);
            return 0;
        }

        left = right;
    }

    return -1;
}